

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

ON_PointCloud * __thiscall ON_PointCloud::operator=(ON_PointCloud *this,ON_PointCloud *src)

{
  ON_PointCloud *src_local;
  ON_PointCloud *this_local;
  
  if (this != src) {
    Destroy(this);
    ON_Geometry::operator=(&this->super_ON_Geometry,&src->super_ON_Geometry);
    ON_3dPointArray::operator=(&this->m_P,&src->m_P);
    ON_SimpleArray<bool>::operator=(&this->m_H,&src->m_H);
    ON_SimpleArray<ON_Color>::operator=(&this->m_C,&src->m_C);
    ON_SimpleArray<double>::operator=(&this->m_V,&src->m_V);
    ON_SimpleArray<ON_3dVector>::operator=(&this->m_N,&src->m_N);
    this->m_hidden_count = src->m_hidden_count;
    memcpy(&this->m_plane,&src->m_plane,0x80);
    memcpy(&this->m_bbox,&src->m_bbox,0x30);
    this->m_flags = src->m_flags;
  }
  return this;
}

Assistant:

ON_PointCloud& ON_PointCloud::operator=( const ON_PointCloud& src )
{
  if ( this != &src ) {
    Destroy();
    ON_Geometry::operator=(src);
    m_P = src.m_P;
    m_H = src.m_H;
    m_C = src.m_C;
    m_V = src.m_V;
    m_N = src.m_N;
    m_hidden_count = src.m_hidden_count;

    m_plane = src.m_plane;
    m_bbox = src.m_bbox;
    m_flags = src.m_flags;
  }
  return *this;
}